

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

void __thiscall ArgumentParser::Instance::Consume(Instance *this,size_t pos,string_view arg)

{
  ActionMap *pAVar1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  basic_string_view<char,_std::char_traits<char>_> __args;
  bool bVar2;
  Continue CVar3;
  pointer ppVar4;
  pointer ppVar5;
  __normal_iterator<const_std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
  local_78;
  __normal_iterator<const_std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
  local_70;
  const_iterator pit;
  __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  local_48;
  Instance *local_40;
  char *local_38;
  __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  local_30;
  const_iterator it;
  size_t pos_local;
  Instance *this_local;
  string_view arg_local;
  
  local_38 = arg._M_str;
  local_40 = (Instance *)arg._M_len;
  it._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)pos;
  this_local = local_40;
  arg_local._M_len = (size_t)local_38;
  local_30._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)KeywordActionMap::Find(&this->Bindings->Keywords,arg);
  local_48._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)std::
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          ::end((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 *)this->Bindings);
  bVar2 = __gnu_cxx::operator!=(&local_30,&local_48);
  if (bVar2) {
    FinishKeyword(this);
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
             ::operator->(&local_30);
    (this->Keyword)._M_len = (ppVar4->first)._M_len;
    (this->Keyword)._M_str = (ppVar4->first)._M_str;
    this->KeywordValuesSeen = 0;
    this->DoneWithPositional = true;
    bVar2 = std::function::operator_cast_to_bool((function *)&this->Bindings->ParsedKeyword);
    if (bVar2) {
      pAVar1 = this->Bindings;
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
               ::operator->(&local_30);
      std::
      function<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()(&pAVar1->ParsedKeyword,this,ppVar4->first);
    }
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
             ::operator->(&local_30);
    std::function<void_(ArgumentParser::Instance_&)>::operator()(&ppVar4->second,this);
  }
  else {
    bVar2 = std::function::operator_cast_to_bool((function *)&this->KeywordValueFunc);
    if (bVar2) {
      pit._M_current =
           (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
            *)this_local;
      __args._M_str = (char *)arg_local._M_len;
      __args._M_len = (size_t)this_local;
      CVar3 = std::
              function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
              ::operator()(&this->KeywordValueFunc,__args);
      if (CVar3 == No) {
        std::
        function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
        operator=(&this->KeywordValueFunc,(nullptr_t)0x0);
      }
      this->KeywordValuesSeen = this->KeywordValuesSeen + 1;
    }
    else {
      if ((this->DoneWithPositional & 1U) == 0) {
        local_70._M_current =
             (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
              *)PositionActionMap::Find(&this->Bindings->Positions,(size_t)it._M_current);
        local_78._M_current =
             (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
              *)std::
                vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                ::end(&(this->Bindings->Positions).
                       super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                     );
        bVar2 = __gnu_cxx::operator!=(&local_70,&local_78);
        if (bVar2) {
          ppVar5 = __gnu_cxx::
                   __normal_iterator<const_std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
                   ::operator->(&local_70);
          __args_2._M_str = (char *)arg_local._M_len;
          __args_2._M_len = (size_t)this_local;
          std::
          function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator()(&ppVar5->second,this,(unsigned_long)it._M_current,__args_2);
          return;
        }
      }
      if (this->UnparsedArguments !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   this->UnparsedArguments,
                   (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      }
    }
  }
  return;
}

Assistant:

void Instance::Consume(std::size_t pos, cm::string_view arg)
{
  auto const it = this->Bindings.Keywords.Find(arg);
  if (it != this->Bindings.Keywords.end()) {
    this->FinishKeyword();
    this->Keyword = it->first;
    this->KeywordValuesSeen = 0;
    this->DoneWithPositional = true;
    if (this->Bindings.ParsedKeyword) {
      this->Bindings.ParsedKeyword(*this, it->first);
    }
    it->second(*this);
    return;
  }

  if (this->KeywordValueFunc) {
    switch (this->KeywordValueFunc(arg)) {
      case Continue::Yes:
        break;
      case Continue::No:
        this->KeywordValueFunc = nullptr;
        break;
    }
    ++this->KeywordValuesSeen;
    return;
  }

  if (!this->DoneWithPositional) {
    auto const pit = this->Bindings.Positions.Find(pos);
    if (pit != this->Bindings.Positions.end()) {
      pit->second(*this, pos, arg);
      return;
    }
  }

  if (this->UnparsedArguments != nullptr) {
    this->UnparsedArguments->emplace_back(arg);
  }
}